

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextVoid(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  uint button;
  ImGuiWindow *pIVar2;
  uint in_ESI;
  char *in_RDI;
  ImGuiWindow *unaff_retaddr;
  int mouse_button;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiPopupFlags in_stack_00000030;
  ImGuiID in_stack_00000034;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == (char *)0x0) {
    in_RDI = "void_context";
  }
  ImGuiWindow::GetID(unaff_retaddr,in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  button = in_ESI & 0x1f;
  bVar1 = IsMouseReleased(button);
  if (((bVar1) && (bVar1 = IsWindowHovered(button), !bVar1)) &&
     (pIVar2 = GetTopMostPopupModal(), pIVar2 == (ImGuiWindow *)0x0)) {
    OpenPopupEx(in_stack_00000034,in_stack_00000030);
  }
  bVar1 = BeginPopupEx((ImGuiID)window,id);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    if (!str_id)
        str_id = "void_context";
    ImGuiID id = window->GetID(str_id);
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && !IsWindowHovered(ImGuiHoveredFlags_AnyWindow))
        if (GetTopMostPopupModal() == NULL)
            OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}